

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::checkValidHere(Forth *this,char *name)

{
  pointer pVVar1;
  allocator<char> local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pVVar1 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->dataPointer < pVVar1[2].start) || (pVVar1[2].end <= this->dataPointer)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_91);
    std::operator+(&local_70,&local_30,": HERE outside data space ");
    std::__cxx11::to_string(&local_90,this->dataPointer);
    std::operator+(&local_50,&local_70,&local_90);
    throwCppExceptionMessage(this,&local_50,errorInvalidAddress);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void checkValidHere(const char* name) {
			RUNTIME_ERROR_IF(getDataPointer() < VirtualMemory[vmSegmentDataSpace].start || 
				VirtualMemory[vmSegmentDataSpace].end <= getDataPointer(),
				std::string(name) + ": HERE outside data space "+std::to_string(getDataPointer()),errorInvalidAddress);
		}